

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_endpoint.hpp
# Opt level: O0

void __thiscall
websocketpp::server<websocketpp::config::asio>::start_accept
          (server<websocketpp::config::asio> *this,error_code *ec)

{
  bool bVar1;
  element_type *this_00;
  accept_handler *in_RSI;
  endpoint<websocketpp::config::asio::transport_config> *in_RDI;
  error_code eVar2;
  endpoint<websocketpp::config::asio::transport_config> *unaff_retaddr;
  connection_ptr con;
  server<websocketpp::config::asio> *in_stack_fffffffffffffee8;
  error_code *in_stack_fffffffffffffef0;
  _Bind<void_(websocketpp::server<websocketpp::config::asio>::*(websocketpp::server<websocketpp::config::asio>_*,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_const_std::error_code_&)>
  *in_stack_fffffffffffffef8;
  function<void_(const_std::error_code_&)> *this_01;
  offset_in_server<websocketpp::config::asio>_to_subr *in_stack_ffffffffffffff08;
  error_code *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  function<void_(const_std::error_code_&)> local_40;
  undefined4 uStack_1c;
  error_code *in_stack_ffffffffffffffe8;
  
  bVar1 = transport::asio::endpoint<websocketpp::config::asio::transport_config>::is_listening
                    (in_RDI);
  if (bVar1) {
    std::error_code::error_code(in_stack_fffffffffffffef0);
    *(_Manager_type *)&(in_RSI->super__Function_base)._M_functor =
         local_40.super__Function_base._M_manager;
    *(_Invoker_type *)((long)&(in_RSI->super__Function_base)._M_functor + 8) = local_40._M_invoker;
    get_connection(in_stack_fffffffffffffee8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_40);
    if (bVar1) {
      this_01 = &local_40;
      std::
      static_pointer_cast<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,websocketpp::connection<websocketpp::config::asio>>
                ((shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
                 in_stack_fffffffffffffef8);
      std::
      bind<void(websocketpp::server<websocketpp::config::asio>::*)(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::error_code_const&),websocketpp::server<websocketpp::config::asio>*,std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>&,std::_Placeholder<1>const&>
                (in_stack_ffffffffffffff08,(server<websocketpp::config::asio> **)this_01,
                 (shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
                 in_stack_fffffffffffffef8,(_Placeholder<1> *)in_stack_fffffffffffffef0);
      std::function<void(std::error_code_const&)>::
      function<std::_Bind<void(websocketpp::server<websocketpp::config::asio>::*(websocketpp::server<websocketpp::config::asio>*,std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>))(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::error_code_const&)>,void>
                (this_01,in_stack_fffffffffffffef8);
      transport::asio::endpoint<websocketpp::config::asio::transport_config>::async_accept
                (unaff_retaddr,(transport_con_ptr *)in_RDI,in_RSI,in_stack_ffffffffffffffe8);
      std::function<void_(const_std::error_code_&)>::~function
                ((function<void_(const_std::error_code_&)> *)0x2e5cde);
      std::
      _Bind<void_(websocketpp::server<websocketpp::config::asio>::*(websocketpp::server<websocketpp::config::asio>_*,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_const_std::error_code_&)>
      ::~_Bind((_Bind<void_(websocketpp::server<websocketpp::config::asio>::*(websocketpp::server<websocketpp::config::asio>_*,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_const_std::error_code_&)>
                *)0x2e5ce8);
      std::
      shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
      ::~shared_ptr((shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
                     *)0x2e5cf5);
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_RSI);
      if ((bVar1) &&
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_40), bVar1)) {
        this_00 = std::
                  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2e5d2e);
        std::error_code::error_code((error_code *)this_00);
        connection<websocketpp::config::asio>::terminate
                  ((connection<websocketpp::config::asio> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8);
      }
    }
    else {
      eVar2 = error::make_error_code(0);
      *(ulong *)&(in_RSI->super__Function_base)._M_functor =
           CONCAT44(in_stack_ffffffffffffffb4,eVar2._M_value);
      *(error_category **)((long)&(in_RSI->super__Function_base)._M_functor + 8) = eVar2._M_cat;
    }
    std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>::~shared_ptr
              ((shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)0x2e5dd3);
  }
  else {
    eVar2 = error::make_error_code(0);
    *(ulong *)&(in_RSI->super__Function_base)._M_functor = CONCAT44(uStack_1c,eVar2._M_value);
    *(error_category **)((long)&(in_RSI->super__Function_base)._M_functor + 8) = eVar2._M_cat;
  }
  return;
}

Assistant:

void start_accept(lib::error_code & ec) {
        if (!transport_type::is_listening()) {
            ec = error::make_error_code(error::async_accept_not_listening);
            return;
        }
        
        ec = lib::error_code();
        connection_ptr con = get_connection();

        if (!con) {
          ec = error::make_error_code(error::con_creation_failed);
          return;
        }

        transport_type::async_accept(
            lib::static_pointer_cast<transport_con_type>(con),
            lib::bind(&type::handle_accept,this,con,lib::placeholders::_1),
            ec
        );

        if (ec && con) {
            // If the connection was constructed but the accept failed,
            // terminate the connection to prevent memory leaks
            con->terminate(lib::error_code());
        }
    }